

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereKeyStats(Parse *pParse,Index *pIdx,UnpackedRecord *pRec,int roundUp,tRowcnt *aStat)

{
  ushort uVar1;
  IndexSample *pIVar2;
  tRowcnt tVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  u64 uVar7;
  long lVar8;
  long lVar9;
  uint local_68;
  uint local_64;
  tRowcnt iGap;
  tRowcnt iUpper;
  int n;
  int iSamp;
  tRowcnt iLower;
  int nField;
  int res;
  int iTest;
  int iMin;
  int iSample;
  int i;
  int iCol;
  IndexSample *aSample;
  tRowcnt *aStat_local;
  int roundUp_local;
  UnpackedRecord *pRec_local;
  Index *pIdx_local;
  Parse *pParse_local;
  
  pIVar2 = pIdx->aSample;
  res = 0;
  n = 0;
  uVar1 = pRec->nField;
  uVar4 = (uint)uVar1;
  iSample = 0;
  iTest = pIdx->nSample * uVar4;
  do {
    iVar5 = (res + iTest) / 2;
    iVar6 = iVar5 / (int)uVar4;
    if (iVar6 < 1) {
      iGap = iVar5 + 1;
    }
    else {
      tVar3 = iVar5 % (int)uVar4;
      do {
        iGap = tVar3 + 1;
        if ((int)uVar4 <= (int)iGap) break;
        lVar8 = (long)(int)tVar3;
        lVar9 = (long)(int)tVar3;
        tVar3 = iGap;
      } while (pIVar2[iVar6 + -1].anLt[lVar8] == pIVar2[iVar6].anLt[lVar9]);
    }
    pRec->nField = (u16)iGap;
    iLower = sqlite3VdbeRecordCompare(pIVar2[iVar6].n,pIVar2[iVar6].p,pRec);
    if ((int)iLower < 0) {
      n = pIVar2[iVar6].anLt[(int)(iGap - 1)] + pIVar2[iVar6].anEq[(int)(iGap - 1)];
      res = iVar5 + 1;
    }
    else if ((iLower == 0) && ((int)iGap < (int)uVar4)) {
      n = pIVar2[iVar6].anLt[(int)(iGap - 1)];
      res = iVar5 + 1;
      iLower = 0xffffffff;
    }
    else {
      iSample = iGap - 1;
      iTest = iVar5;
    }
    if (iLower == 0 || iTest <= res) {
      iVar5 = iTest / (int)uVar4;
      if (iLower == 0) {
        *aStat = pIVar2[iVar5].anLt[iSample];
        aStat[1] = pIVar2[iVar5].anEq[iSample];
      }
      else {
        if (iVar5 < pIdx->nSample) {
          local_64 = pIVar2[iVar5].anLt[iSample];
        }
        else {
          uVar7 = sqlite3LogEstToInt(*pIdx->aiRowLogEst);
          local_64 = (uint)uVar7;
        }
        if ((uint)n < local_64) {
          local_68 = local_64 - n;
        }
        else {
          local_68 = 0;
        }
        if (roundUp != 0) {
          local_68 = local_68 << 1;
        }
        local_68 = local_68 / 3;
        *aStat = n + local_68;
        aStat[1] = pIdx->aAvgEq[(int)(uVar4 - 1)];
      }
      pRec->nField = uVar1;
      return iVar5;
    }
  } while( true );
}

Assistant:

static int whereKeyStats(
  Parse *pParse,              /* Database connection */
  Index *pIdx,                /* Index to consider domain of */
  UnpackedRecord *pRec,       /* Vector of values to consider */
  int roundUp,                /* Round up if true.  Round down if false */
  tRowcnt *aStat              /* OUT: stats written here */
){
  IndexSample *aSample = pIdx->aSample;
  int iCol;                   /* Index of required stats in anEq[] etc. */
  int i;                      /* Index of first sample >= pRec */
  int iSample;                /* Smallest sample larger than or equal to pRec */
  int iMin = 0;               /* Smallest sample not yet tested */
  int iTest;                  /* Next sample to test */
  int res;                    /* Result of comparison operation */
  int nField;                 /* Number of fields in pRec */
  tRowcnt iLower = 0;         /* anLt[] + anEq[] of largest sample pRec is > */

#ifndef SQLITE_DEBUG
  UNUSED_PARAMETER( pParse );
#endif
  assert( pRec!=0 );
  assert( pIdx->nSample>0 );
  assert( pRec->nField>0 && pRec->nField<=pIdx->nSampleCol );

  /* Do a binary search to find the first sample greater than or equal
  ** to pRec. If pRec contains a single field, the set of samples to search
  ** is simply the aSample[] array. If the samples in aSample[] contain more
  ** than one fields, all fields following the first are ignored.
  **
  ** If pRec contains N fields, where N is more than one, then as well as the
  ** samples in aSample[] (truncated to N fields), the search also has to
  ** consider prefixes of those samples. For example, if the set of samples
  ** in aSample is:
  **
  **     aSample[0] = (a, 5) 
  **     aSample[1] = (a, 10) 
  **     aSample[2] = (b, 5) 
  **     aSample[3] = (c, 100) 
  **     aSample[4] = (c, 105)
  **
  ** Then the search space should ideally be the samples above and the 
  ** unique prefixes [a], [b] and [c]. But since that is hard to organize, 
  ** the code actually searches this set:
  **
  **     0: (a) 
  **     1: (a, 5) 
  **     2: (a, 10) 
  **     3: (a, 10) 
  **     4: (b) 
  **     5: (b, 5) 
  **     6: (c) 
  **     7: (c, 100) 
  **     8: (c, 105)
  **     9: (c, 105)
  **
  ** For each sample in the aSample[] array, N samples are present in the
  ** effective sample array. In the above, samples 0 and 1 are based on 
  ** sample aSample[0]. Samples 2 and 3 on aSample[1] etc.
  **
  ** Often, sample i of each block of N effective samples has (i+1) fields.
  ** Except, each sample may be extended to ensure that it is greater than or
  ** equal to the previous sample in the array. For example, in the above, 
  ** sample 2 is the first sample of a block of N samples, so at first it 
  ** appears that it should be 1 field in size. However, that would make it 
  ** smaller than sample 1, so the binary search would not work. As a result, 
  ** it is extended to two fields. The duplicates that this creates do not 
  ** cause any problems.
  */
  nField = pRec->nField;
  iCol = 0;
  iSample = pIdx->nSample * nField;
  do{
    int iSamp;                    /* Index in aSample[] of test sample */
    int n;                        /* Number of fields in test sample */

    iTest = (iMin+iSample)/2;
    iSamp = iTest / nField;
    if( iSamp>0 ){
      /* The proposed effective sample is a prefix of sample aSample[iSamp].
      ** Specifically, the shortest prefix of at least (1 + iTest%nField) 
      ** fields that is greater than the previous effective sample.  */
      for(n=(iTest % nField) + 1; n<nField; n++){
        if( aSample[iSamp-1].anLt[n-1]!=aSample[iSamp].anLt[n-1] ) break;
      }
    }else{
      n = iTest + 1;
    }

    pRec->nField = n;
    res = sqlite3VdbeRecordCompare(aSample[iSamp].n, aSample[iSamp].p, pRec);
    if( res<0 ){
      iLower = aSample[iSamp].anLt[n-1] + aSample[iSamp].anEq[n-1];
      iMin = iTest+1;
    }else if( res==0 && n<nField ){
      iLower = aSample[iSamp].anLt[n-1];
      iMin = iTest+1;
      res = -1;
    }else{
      iSample = iTest;
      iCol = n-1;
    }
  }while( res && iMin<iSample );
  i = iSample / nField;

#ifdef SQLITE_DEBUG
  /* The following assert statements check that the binary search code
  ** above found the right answer. This block serves no purpose other
  ** than to invoke the asserts.  */
  if( pParse->db->mallocFailed==0 ){
    if( res==0 ){
      /* If (res==0) is true, then pRec must be equal to sample i. */
      assert( i<pIdx->nSample );
      assert( iCol==nField-1 );
      pRec->nField = nField;
      assert( 0==sqlite3VdbeRecordCompare(aSample[i].n, aSample[i].p, pRec) 
           || pParse->db->mallocFailed 
      );
    }else{
      /* Unless i==pIdx->nSample, indicating that pRec is larger than
      ** all samples in the aSample[] array, pRec must be smaller than the
      ** (iCol+1) field prefix of sample i.  */
      assert( i<=pIdx->nSample && i>=0 );
      pRec->nField = iCol+1;
      assert( i==pIdx->nSample 
           || sqlite3VdbeRecordCompare(aSample[i].n, aSample[i].p, pRec)>0
           || pParse->db->mallocFailed );

      /* if i==0 and iCol==0, then record pRec is smaller than all samples
      ** in the aSample[] array. Otherwise, if (iCol>0) then pRec must
      ** be greater than or equal to the (iCol) field prefix of sample i.
      ** If (i>0), then pRec must also be greater than sample (i-1).  */
      if( iCol>0 ){
        pRec->nField = iCol;
        assert( sqlite3VdbeRecordCompare(aSample[i].n, aSample[i].p, pRec)<=0
             || pParse->db->mallocFailed );
      }
      if( i>0 ){
        pRec->nField = nField;
        assert( sqlite3VdbeRecordCompare(aSample[i-1].n, aSample[i-1].p, pRec)<0
             || pParse->db->mallocFailed );
      }
    }
  }
#endif /* ifdef SQLITE_DEBUG */

  if( res==0 ){
    /* Record pRec is equal to sample i */
    assert( iCol==nField-1 );
    aStat[0] = aSample[i].anLt[iCol];
    aStat[1] = aSample[i].anEq[iCol];
  }else{
    /* At this point, the (iCol+1) field prefix of aSample[i] is the first 
    ** sample that is greater than pRec. Or, if i==pIdx->nSample then pRec
    ** is larger than all samples in the array. */
    tRowcnt iUpper, iGap;
    if( i>=pIdx->nSample ){
      iUpper = sqlite3LogEstToInt(pIdx->aiRowLogEst[0]);
    }else{
      iUpper = aSample[i].anLt[iCol];
    }

    if( iLower>=iUpper ){
      iGap = 0;
    }else{
      iGap = iUpper - iLower;
    }
    if( roundUp ){
      iGap = (iGap*2)/3;
    }else{
      iGap = iGap/3;
    }
    aStat[0] = iLower + iGap;
    aStat[1] = pIdx->aAvgEq[nField-1];
  }

  /* Restore the pRec->nField value before returning.  */
  pRec->nField = nField;
  return i;
}